

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_from_signed62(secp256k1_fe *r,secp256k1_modinv64_signed62 *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  
  uVar1 = a->v[0];
  if (uVar1 >> 0x3e == 0) {
    uVar2 = a->v[1];
    if (uVar2 < 0x4000000000000000) {
      uVar3 = a->v[2];
      if (uVar3 < 0x4000000000000000) {
        uVar4 = a->v[3];
        if (uVar4 < 0x4000000000000000) {
          uVar5 = a->v[4];
          if (uVar5 < 0x100) {
            r->n[0] = uVar1 & 0xfffffffffffff;
            r->n[1] = (uVar2 & 0x3ffffffffff) << 10 | uVar1 >> 0x34;
            r->n[2] = (uVar3 & 0xffffffff) << 0x14 | uVar2 >> 0x2a;
            r->n[3] = (ulong)((uint)uVar4 & 0x3fffff) << 0x1e | uVar3 >> 0x20;
            r->n[4] = uVar5 << 0x28 | uVar4 >> 0x16;
            return;
          }
          pcVar7 = "test condition failed: a4 >> 8 == 0";
          uVar6 = 0x1c6;
        }
        else {
          pcVar7 = "test condition failed: a3 >> 62 == 0";
          uVar6 = 0x1c5;
        }
      }
      else {
        pcVar7 = "test condition failed: a2 >> 62 == 0";
        uVar6 = 0x1c4;
      }
    }
    else {
      pcVar7 = "test condition failed: a1 >> 62 == 0";
      uVar6 = 0x1c3;
    }
  }
  else {
    pcVar7 = "test condition failed: a0 >> 62 == 0";
    uVar6 = 0x1c2;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/field_5x52_impl.h"
          ,uVar6,pcVar7);
  abort();
}

Assistant:

static void secp256k1_fe_from_signed62(secp256k1_fe *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t M52 = UINT64_MAX >> 12;
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->n[0] =  a0                   & M52;
    r->n[1] = (a0 >> 52 | a1 << 10) & M52;
    r->n[2] = (a1 >> 42 | a2 << 20) & M52;
    r->n[3] = (a2 >> 32 | a3 << 30) & M52;
    r->n[4] = (a3 >> 22 | a4 << 40);
}